

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

bool __thiscall
ON_SubDEdgeChainHistoryValue::ReportHelper(ON_SubDEdgeChainHistoryValue *this,ON_TextLog *text_log)

{
  int iVar1;
  ON_SubDEdgeChain **ppOVar2;
  int local_1c;
  int count;
  int i;
  ON_TextLog *text_log_local;
  ON_SubDEdgeChainHistoryValue *this_local;
  
  ON_TextLog::Print(text_log,"SubD edge chain value\n");
  ON_TextLog::PushIndent(text_log);
  iVar1 = ON_SimpleArray<ON_SubDEdgeChain_*>::Count(&this->m_value);
  for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
    ppOVar2 = ON_SimpleArray<ON_SubDEdgeChain_*>::operator[](&this->m_value,local_1c);
    if (*ppOVar2 != (ON_SubDEdgeChain *)0x0) {
      ppOVar2 = ON_SimpleArray<ON_SubDEdgeChain_*>::operator[](&this->m_value,local_1c);
      ON_SubDEdgeChain::Dump(*ppOVar2,text_log);
    }
  }
  ON_TextLog::PopIndent(text_log);
  return true;
}

Assistant:

bool ON_SubDEdgeChainHistoryValue::ReportHelper(ON_TextLog& text_log) const
{
  text_log.Print("SubD edge chain value\n");
  text_log.PushIndent();
  int i, count = m_value.Count();
  for (i = 0; i < count; i++)
  {
    if( nullptr != m_value[i])
      m_value[i]->Dump(text_log);
  }
  text_log.PopIndent();
  return true;
}